

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diyfp.h
# Opt level: O2

double __thiscall rapidjson::internal::DiyFp::ToDouble(DiyFp *this)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  RapidJSONException *this_00;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = this->f;
  if (uVar2 >> 0x35 == 0) {
    iVar1 = this->e;
    dVar3 = 0.0;
    if (-0x433 < iVar1) {
      if (iVar1 < 0x3cc) {
        uVar4 = (ulong)(iVar1 + 0x433) << 0x34;
        uVar5 = 0;
        if (iVar1 != -0x432) {
          uVar5 = uVar4;
        }
        if (0xfffffffffffff < uVar2) {
          uVar5 = uVar4;
        }
        dVar3 = (double)(uVar2 & 0xfffffffffffff | uVar5);
      }
      else {
        dVar3 = INFINITY;
      }
    }
    return dVar3;
  }
  this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
  cereal::RapidJSONException::RapidJSONException
            (this_00,"rapidjson internal assertion failure: f <= kDpHiddenBit + kDpSignificandMask")
  ;
  __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

double ToDouble() const {
        union {
            double d;
            uint64_t u64;
        }u;
        CEREAL_RAPIDJSON_ASSERT(f <= kDpHiddenBit + kDpSignificandMask);
        if (e < kDpDenormalExponent) {
            // Underflow.
            return 0.0;
        }
        if (e >= kDpMaxExponent) {
            // Overflow.
            return std::numeric_limits<double>::infinity();
        }
        const uint64_t be = (e == kDpDenormalExponent && (f & kDpHiddenBit) == 0) ? 0 :
            static_cast<uint64_t>(e + kDpExponentBias);
        u.u64 = (f & kDpSignificandMask) | (be << kDpSignificandSize);
        return u.d;
    }